

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O2

void print_bits(uint8_t bits,char **str_array)

{
  for (; bits != 0; bits = bits >> 1) {
    if ((bits & 1) != 0) {
      printf("%s | ",*str_array);
    }
    str_array = str_array + 1;
  }
  return;
}

Assistant:

void print_bits(uint8_t bits, char *str_array[]) {
    int i = 0;

    while (bits) {
        if (bits & 1) {
            printf("%s | ", str_array[i]);
        }
        bits >>= 1;
        i++;
    }
}